

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

void __thiscall
CTcParser::parse_formal_list
          (CTcParser *this,int count_only,int opt_allowed,int *argc,int *opt_argc,int *varargs,
          int *varargs_list,CTcSymLocal **varargs_list_local,int *err,int base_formal_num,
          int for_short_anon_func,CTcFormalTypeList **type_list)

{
  undefined1 *puVar1;
  int iVar2;
  uint uVar3;
  textchar_t *sym;
  bool bVar4;
  short sVar5;
  int iVar6;
  tc_toktyp_t tVar7;
  CTcFormalTypeList *pCVar8;
  ulong uVar9;
  CTcSymLocal *pCVar10;
  CTcToken *pCVar11;
  CTcSymbol *pCVar12;
  CTcSymObjBase *this_00;
  CTcPrsNode *pCVar13;
  byte bVar14;
  char *siz;
  tc_toktyp_t tVar15;
  undefined8 uVar16;
  int iVar17;
  bool bVar18;
  bool bVar19;
  CTcToken init_tok;
  int local_94;
  CTcToken local_78;
  code *local_48;
  undefined8 local_40;
  int *local_38;
  
  tVar15 = TOKT_COLON;
  if (for_short_anon_func == 0) {
    tVar15 = TOKT_RPAR;
  }
  iVar6 = 0x2ba0;
  if (for_short_anon_func == 0) {
    iVar6 = 0x2b1e;
  }
  *argc = 0;
  if (opt_argc != (int *)0x0) {
    *opt_argc = 0;
  }
  *varargs = 0;
  *varargs_list = 0;
  *err = 0;
  bVar18 = (G_tok->curtok_).typ_ == tVar15;
  if (bVar18) {
    CTcTokenizer::next(G_tok);
  }
  else {
    local_48 = CTcSymObjBase::mark_referenced;
    local_94 = 0;
    local_38 = varargs;
    do {
      tVar7 = (G_tok->curtok_).typ_;
      uVar9 = (ulong)tVar7;
      iVar17 = iVar6;
      if (uVar9 < 0x2b) {
        if ((0x40001800004U >> (uVar9 & 0x3f) & 1) != 0) goto LAB_00204b82;
        if (uVar9 == 8) {
          sVar5 = 0;
          if (type_list == (CTcFormalTypeList **)0x0) {
            bVar19 = false;
          }
          else {
            pCVar11 = CTcTokenizer::copycur(G_tok);
            local_78.typ_ = pCVar11->typ_;
            local_78._4_4_ = *(undefined4 *)&pCVar11->field_0x4;
            local_78.text_ = pCVar11->text_;
            local_78.text_len_ = pCVar11->text_len_;
            local_78.int_val_ = pCVar11->int_val_;
            local_78._32_8_ = *(undefined8 *)&pCVar11->field_0x20;
            tVar7 = CTcTokenizer::next(G_tok);
            bVar19 = tVar7 == TOKT_SYM;
            if (bVar19) {
              if (*type_list == (CTcFormalTypeList *)0x0) {
                pCVar8 = (CTcFormalTypeList *)CTcPrsMem::alloc(G_prsmem,0x18);
                pCVar8->head_ = (CTcFormalTypeEle *)0x0;
                pCVar8->tail_ = (CTcFormalTypeEle *)0x0;
                pCVar8->varargs_ = 0;
                *type_list = pCVar8;
                if (0 < *argc) {
                  iVar17 = *argc + 1;
                  do {
                    CTcFormalTypeList::add_untyped_param(pCVar8);
                    iVar17 = iVar17 + -1;
                  } while (1 < iVar17);
                }
              }
              CTcFormalTypeList::add_typed_param(*type_list,&local_78);
              siz = local_78.text_;
              pCVar12 = CTcPrsSymtab::find(this->global_symtab_,local_78.text_,local_78.text_len_,
                                           (CTcPrsSymtab **)0x0);
              if (pCVar12 == (CTcSymbol *)0x0) {
                this_00 = (CTcSymObjBase *)
                          CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,(size_t)siz);
                uVar3 = G_cg->next_obj_;
                G_cg->next_obj_ = uVar3 + 1;
                CTcSymObjBase::CTcSymObjBase
                          (this_00,local_78.text_,local_78.text_len_,0,(ulong)uVar3,1,
                           TC_META_TADSOBJ,(CTcDictEntry *)0x0);
                (this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                super_CVmHashEntry._vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00320710;
                (*local_48)(this_00);
                (*this->global_symtab_->_vptr_CTcPrsSymtab[3])(this->global_symtab_,this_00);
              }
              else {
                iVar17 = *(int *)&(pCVar12->super_CTcSymbolBase).super_CVmHashEntryCS.
                                  super_CVmHashEntry.field_0x24;
                if ((iVar17 != 2) && (iVar17 != 9)) {
                  CTcTokenizer::log_error(0x2bca,local_78.text_len_ & 0xffffffff,local_78.text_);
                }
              }
            }
            else {
              CTcTokenizer::unget(G_tok);
            }
          }
          sym = (G_tok->curtok_).text_;
          uVar9 = (G_tok->curtok_).text_len_;
          CTcTokenizer::next(G_tok);
          if ((G_tok->curtok_).typ_ == TOKT_COLON) {
            tVar7 = CTcTokenizer::next(G_tok);
            sVar5 = 1;
            bVar14 = 1;
            if (((for_short_anon_func != 0) && (tVar7 != TOKT_COMMA)) && (tVar7 != TOKT_COLON)) {
              CTcTokenizer::unget(G_tok);
              bVar14 = 0;
              sVar5 = 0;
            }
            if ((bool)(bVar14 & bVar19)) {
              CTcTokenizer::log_error(0x2bd1,uVar9 & 0xffffffff,sym);
              sVar5 = 1;
            }
          }
          if ((opt_allowed == 0) ||
             ((tVar7 = (G_tok->curtok_).typ_, tVar7 != TOKT_QUESTION && (tVar7 != TOKT_EQ)))) {
            pCVar13 = (CTcPrsNode *)0x0;
            bVar4 = false;
            uVar16 = 0;
          }
          else {
            if ((char)sVar5 == '\0' && opt_argc != (int *)0x0) {
              *opt_argc = *opt_argc + 1;
            }
            CTcTokenizer::next(G_tok);
            uVar16 = CONCAT62((int6)((ulong)opt_argc >> 0x10),4);
            bVar4 = true;
            if (tVar7 == TOKT_EQ) {
              pCVar13 = parse_asi_expr(this);
            }
            else {
              pCVar13 = (CTcPrsNode *)0x0;
            }
          }
          if ((opt_allowed != 0 && opt_argc != (int *)0x0) &&
             ((!bVar4 && (char)sVar5 == '\0') && *opt_argc != 0)) {
            CTcTokenizer::log_error(0x2bd0,uVar9 & 0xffffffff,sym);
          }
          if (count_only == 0) {
            local_40 = uVar16;
            create_scope_local_symtab(this);
            if ((bool)(sVar5 == 0 & (bVar4 ^ 1U))) {
              pCVar10 = CTcPrsSymtab::add_formal
                                  (this->local_symtab_,sym,uVar9,*argc + base_formal_num,0);
            }
            else {
              iVar17 = this->local_cnt_;
              if (this->max_local_cnt_ <= iVar17) {
                this->max_local_cnt_ = iVar17 + 1;
              }
              this->local_cnt_ = iVar17 + 1;
              pCVar10 = CTcPrsSymtab::add_local(this->local_symtab_,sym,uVar9,iVar17,0,0,0);
              *(ushort *)&(pCVar10->super_CTcSymLocalBase).field_0x64 =
                   (ushort)local_40 | sVar5 * 2 |
                   (ushort)*(undefined4 *)&(pCVar10->super_CTcSymLocalBase).field_0x64 & 0xfff9;
              if (pCVar13 != (CTcPrsNode *)0x0) {
                (pCVar10->super_CTcSymLocalBase).defval_expr_ = pCVar13;
                (pCVar10->super_CTcSymLocalBase).defval_seqno_ = local_94;
                local_94 = local_94 + 1;
              }
            }
            if ((sVar5 == 0) && (pCVar10 != (CTcSymLocal *)0x0)) {
              (pCVar10->super_CTcSymLocalBase).param_index_ = *argc;
            }
          }
          if (((sVar5 == 0) && (*argc = *argc + 1, type_list != (CTcFormalTypeList **)0x0)) &&
             (!bVar19 && *type_list != (CTcFormalTypeList *)0x0)) {
            CTcFormalTypeList::add_untyped_param(*type_list);
          }
          varargs = local_38;
          tVar7 = (G_tok->curtok_).typ_;
          if (tVar7 == tVar15) goto LAB_00205197;
          if (TOKT_SEM < tVar7) {
LAB_002051d4:
            iVar17 = 0x2b1c;
            goto LAB_002051d9;
          }
          uVar9 = (ulong)tVar7;
          if ((0x40009800004U >> (uVar9 & 0x3f) & 1) == 0) {
            if (uVar9 != 8) {
              if (uVar9 != 0x15) goto LAB_002051d4;
              goto LAB_002051e1;
            }
            CTcTokenizer::log_error_curtok(G_tok,0x2b1c);
          }
          goto LAB_002051a4;
        }
        if (uVar9 != 0x19) goto LAB_00204cba;
        *varargs = 1;
        if ((type_list != (CTcFormalTypeList **)0x0) && (*type_list != (CTcFormalTypeList *)0x0)) {
          (*type_list)->varargs_ = 1;
        }
        tVar7 = CTcTokenizer::next(G_tok);
        if (tVar7 == TOKT_RBRACK) goto LAB_00204cc6;
        if (tVar7 == TOKT_SYM) {
          if (count_only == 0) {
            create_scope_local_symtab(this);
            *varargs_list = 1;
            iVar2 = this->local_cnt_;
            if (this->max_local_cnt_ <= iVar2) {
              this->max_local_cnt_ = iVar2 + 1;
            }
            this->local_cnt_ = iVar2 + 1;
            pCVar10 = CTcPrsSymtab::add_local
                                (this->local_symtab_,(G_tok->curtok_).text_,
                                 (G_tok->curtok_).text_len_,iVar2,0,1,0);
            *varargs_list_local = pCVar10;
            puVar1 = &(pCVar10->super_CTcSymLocalBase).field_0x64;
            *puVar1 = *puVar1 | 8;
          }
          tVar7 = CTcTokenizer::next(G_tok);
          if ((tVar7 - TOKT_LBRACE < 2) || (tVar7 == TOKT_EOF)) {
            iVar17 = 0x2b7e;
            goto LAB_00204b82;
          }
          if (tVar7 == TOKT_RBRACK) {
            tVar7 = CTcTokenizer::next(G_tok);
            if (tVar7 != tVar15) {
              tVar7 = (G_tok->curtok_).typ_;
              if (tVar7 < TOKT_LBRACK) {
                if ((0x1880004U >> (tVar7 & TOKT_MINUS) & 1) != 0) goto LAB_00204b82;
                if (tVar7 == TOKT_COMMA) {
                  iVar17 = 0x2b7d;
                  goto LAB_00204d06;
                }
              }
              CTcTokenizer::log_error_curtok(G_tok,iVar6);
              tVar7 = CTcTokenizer::next(G_tok);
              bVar18 = true;
              if (tVar7 == tVar15) goto LAB_002051e1;
              goto LAB_002051a4;
            }
          }
          else {
            CTcTokenizer::log_error_curtok(G_tok,0x2b7e);
          }
LAB_00205197:
          CTcTokenizer::next(G_tok);
        }
        else {
          CTcTokenizer::log_error_curtok(G_tok,0x2b7f);
          tVar7 = (G_tok->curtok_).typ_;
          if (tVar7 == tVar15) goto LAB_00205197;
          if ((TOKT_RBRACE < tVar7) || ((0x1800004U >> (tVar7 & TOKT_MINUS) & 1) == 0))
          goto LAB_002051e1;
        }
LAB_0020519f:
        bVar18 = true;
      }
      else {
LAB_00204cba:
        if (tVar7 == TOKT_ELLIPSIS) {
          *varargs = 1;
LAB_00204cc6:
          if ((type_list != (CTcFormalTypeList **)0x0) && (*type_list != (CTcFormalTypeList *)0x0))
          {
            (*type_list)->varargs_ = 1;
          }
          tVar7 = CTcTokenizer::next(G_tok);
          if (tVar7 == tVar15) goto LAB_00205197;
          if ((G_tok->curtok_).typ_ != TOKT_COMMA) {
LAB_00204b82:
            CTcTokenizer::log_error_curtok(G_tok,iVar17);
            goto LAB_0020519f;
          }
          CTcTokenizer::next(G_tok);
          iVar17 = 0x2b27;
LAB_00204d06:
          CTcTokenizer::log_error(iVar17);
        }
        else {
          if (tVar7 == tVar15) {
            CTcTokenizer::log_error(0x2b1d);
            goto LAB_00205197;
          }
          if (for_short_anon_func != 0) {
            iVar17 = 0x2ba0;
            goto LAB_00204b82;
          }
          iVar17 = 0x2b1b;
LAB_002051d9:
          CTcTokenizer::log_error_curtok(G_tok,iVar17);
LAB_002051e1:
          CTcTokenizer::next(G_tok);
        }
      }
LAB_002051a4:
    } while (!bVar18);
  }
  if (((G_tok->curtok_).typ_ == TOKT_SYM) &&
     (iVar6 = CTcTokenizer::cur_tok_matches(G_tok,"multimethod",0xb), iVar6 != 0)) {
    if (type_list == (CTcFormalTypeList **)0x0 || for_short_anon_func != 0) {
      CTcTokenizer::log_error(0x2bc9);
    }
    else if (*type_list == (CTcFormalTypeList *)0x0) {
      pCVar8 = (CTcFormalTypeList *)CTcPrsMem::alloc(G_prsmem,0x18);
      pCVar8->head_ = (CTcFormalTypeEle *)0x0;
      pCVar8->tail_ = (CTcFormalTypeEle *)0x0;
      pCVar8->varargs_ = 0;
      *type_list = pCVar8;
      if (0 < *argc) {
        iVar6 = *argc + 1;
        do {
          CTcFormalTypeList::add_untyped_param(pCVar8);
          iVar6 = iVar6 + -1;
        } while (1 < iVar6);
      }
      if (*varargs != 0) {
        (*type_list)->varargs_ = 1;
      }
    }
    CTcTokenizer::next(G_tok);
  }
  if (opt_argc != (int *)0x0) {
    *argc = *argc - *opt_argc;
  }
  return;
}

Assistant:

void CTcParser::parse_formal_list(
    int count_only, int opt_allowed,
    int *argc, int *opt_argc, int *varargs,
    int *varargs_list, CTcSymLocal **varargs_list_local,
    int *err, int base_formal_num, int for_short_anon_func,
    CTcFormalTypeList **type_list)
{
    CTcSymLocal *lcl = 0;
    CTcToken varname;
    int named_param = FALSE, opt_param = FALSE;
    int is_typed = FALSE;
    int defval_cnt = 0;

    /* 
     *   choose the end token - if this is a normal argument list, the
     *   ending token is a right parenthesis; for a short-form anonymous
     *   function, it's a colon 
     */
    tc_toktyp_t end_tok = (for_short_anon_func ? TOKT_COLON : TOKT_RPAR);
    int missing_end_tok_err = (for_short_anon_func
                           ? TCERR_MISSING_COLON_FORMAL
                           : TCERR_MISSING_RPAR_FORMAL);
    
    /* no arguments yet */
    *argc = 0;
    if (opt_argc != 0)
        *opt_argc = 0;
    *varargs = FALSE;
    *varargs_list = FALSE;

    /* no error yet */
    *err = FALSE;

    /* we've only just begun */
    int done = FALSE;

    /* check for an empty list */
    if (G_tok->cur() == end_tok)
    {
        /* the list is empty - we're already done */
        done = TRUE;

        /* skip the closing token */
        G_tok->next();
    }

    /* keep going until done */
    while (!done)
    {
        tc_toktyp_t suffix_tok = TOKT_INVALID;
        CTcPrsNode *defval_expr = 0;

        /* see what comes next */
        switch(G_tok->cur())
        {
        case TOKT_ELLIPSIS:
            /* it's an ellipsis - note that we have varargs */
            *varargs = TRUE;

        parse_ellipsis:
            /* add the varargs indicator to the formal type list */
            if (type_list != 0 && *type_list != 0)
                (*type_list)->add_ellipsis();

            /* the next token must be the close paren */
            if (G_tok->next() == end_tok)
            {
                /* we've reached the end of the list */
                goto handle_end_tok;
            }
            else
            {
                /* this is an error - guess about the problem */
                switch(G_tok->cur())
                {
                case TOKT_COMMA:
                    /* 
                     *   we seem to have more in the list - log an error,
                     *   but continue parsing the list 
                     */
                    G_tok->next();
                    G_tok->log_error(TCERR_ELLIPSIS_NOT_LAST);
                    break;
                    
                default:
                    /* 
                     *   anything else is probably a missing right paren -
                     *   provide it and exit the formal list 
                     */
                    done = TRUE;
                    G_tok->log_error_curtok(missing_end_tok_err);
                    break;
                }
            }
            break;
            
        case TOKT_LBRACK:
            /* 
             *   varargs with named list variable for last parameter -
             *   this generates setup code that stores the arguments from
             *   this one forward in a list to be stored in this variable 
             */

            /* note that we have varargs */
            *varargs = TRUE;

            /* note it in the type list as well */
            if (type_list != 0 && *type_list != 0)
                (*type_list)->add_ellipsis();

            /* skip the bracket and check that a symbol follows */
            switch(G_tok->next())
            {
            case TOKT_RBRACK:
                /* 
                 *   empty brackets - treat this as identical to an
                 *   ellipsis; since they didn't name the varargs list
                 *   parameter, it's just a varargs indication 
                 */
                goto parse_ellipsis;
                
            case TOKT_SYM:
                /* if we're creating a symbol table, add the symbol */
                if (!count_only)
                {
                    int local_id;
                    
                    /* create a local scope if we haven't already */
                    create_scope_local_symtab();

                    /* note that we have a varargs list parameter */
                    *varargs_list = TRUE;

                    /* 
                     *   insert the new variable as a local - it's not a
                     *   formal, since we're going to take the actuals,
                     *   make a list, and store them in this local; the
                     *   formal in this position will not be named, since
                     *   this is a varargs function 
                     */
                    local_id = alloc_local();
                    *varargs_list_local = local_symtab_->add_local(
                        G_tok->getcur()->get_text(),
                        G_tok->getcur()->get_text_len(),
                        local_id, FALSE, TRUE, FALSE);

                    /* mark it as a list parameter */
                    (*varargs_list_local)->set_list_param(TRUE);
                }

                /* a close bracket must follow */
                switch (G_tok->next())
                {
                case TOKT_RBRACK:
                    /* skip the close bracket, and check for the end token */
                    if (G_tok->next() == end_tok)
                    {
                        /* that's it - the list is done */
                        goto handle_end_tok;
                    }

                    /* we didn't find the end token - guess about the error */
                    switch (G_tok->cur())
                    {
                    case TOKT_COMMA:
                        /* 
                         *   they seem to want another parameter - this is
                         *   an error, but keep parsing anyway 
                         */
                        G_tok->log_error(TCERR_LISTPAR_NOT_LAST);
                        break;

                    case TOKT_LBRACE:
                    case TOKT_RBRACE:
                    case TOKT_LPAR:
                    case TOKT_EOF:
                        /* the ending token was probably just forgotten */
                        G_tok->log_error_curtok(missing_end_tok_err);

                        /* presume that the argument list is done */
                        done = TRUE;
                        break;

                    default:
                        /* end token is missing - log an error */
                        G_tok->log_error_curtok(missing_end_tok_err);

                        /* 
                         *   skip the errant token; if the ending token
                         *   follows this one, skip it as well, since
                         *   there's probably just a stray extra token
                         *   before the ending token 
                         */
                        if (G_tok->next() == end_tok)
                            G_tok->next();

                        /* presume they simply left out the paren */
                        done = TRUE;
                        break;
                    }
                    break;

                case TOKT_LBRACE:
                case TOKT_RBRACE:
                case TOKT_EOF:
                    /* they must have left out the bracket and paren */
                    G_tok->log_error_curtok(TCERR_LISTPAR_REQ_RBRACK);
                    done = TRUE;
                    break;
                    
                default:
                    /* note the missing bracket */
                    G_tok->log_error_curtok(TCERR_LISTPAR_REQ_RBRACK);

                    /* skip the errant token and assume we're done */
                    G_tok->next();
                    done = TRUE;
                    break;
                }
                break;

            default:
                /* log an error */
                G_tok->log_error_curtok(TCERR_LISTPAR_REQ_SYM);

                /* if this is the ending token, we're done */
                if (G_tok->cur() == end_tok)
                    goto handle_end_tok;

                /* 
                 *   if we're not on something that looks like the end of
                 *   the parameter list, skip the errant token 
                 */
                switch(G_tok->cur())
                {
                case TOKT_RBRACE:
                case TOKT_LBRACE:
                case TOKT_EOF:
                    /* looks like they left out the closing markers */
                    done = TRUE;
                    break;

                default:
                    /* 
                     *   skip the errant token and continue - they
                     *   probably have more argument list following 
                     */
                    G_tok->next();
                    break;
                }
                break;
            }
            break;

        case TOKT_SYM:
            /*
             *   If a formal type list is allowed, check to see if the next
             *   token is a symbol - if it is, the current token is the type,
             *   and the next token is the variable name. 
             */
            is_typed = FALSE;
            if (type_list != 0)
            {
                /* save the initial token */
                CTcToken init_tok = *G_tok->copycur();

                /* check the next one */
                if (G_tok->next() == TOKT_SYM)
                {
                    /* 
                     *   We have another symbol, so the first token is the
                     *   type name, and the current token is the param name.
                     *   Add the type to the formal type list.
                     */

                    /* first, make sure we've created the type list */
                    if (*type_list == 0)
                    {
                        /* 
                         *   We haven't created one yet - create it now.
                         *   Since we're just getting around to creating the
                         *   list, add untyped elements for the parameters
                         *   we've seen so far - they all must have been
                         *   untyped, since we create the list on
                         *   encountering the first typed parameter.  
                         */
                        *type_list = new (G_prsmem) CTcFormalTypeList();
                        (*type_list)->add_untyped_params(*argc);
                    }

                    /* add this typed parameter */
                    (*type_list)->add_typed_param(&init_tok);

                    /* flag it as typed */
                    is_typed = TRUE;
                    
                    /* 
                     *   make sure the type symbol is defined as a class or
                     *   object 
                     */
                    CTcSymbol *clsym = global_symtab_->find(
                        init_tok.get_text(), init_tok.get_text_len());
                    if (clsym == 0)
                    {
                        /* it's not defined - add it as an external object */
                        clsym = new CTcSymObj(
                            init_tok.get_text(), init_tok.get_text_len(),
                            FALSE, G_cg->new_obj_id(), TRUE,
                            TC_META_TADSOBJ, 0);

                        /* mark it as referenced */
                        clsym->mark_referenced();

                        /* add it to the table */
                        global_symtab_->add_entry(clsym);
                    }
                    else if (clsym->get_type() != TC_SYM_OBJ
                             && clsym->get_type() != TC_SYM_METACLASS)
                    {
                        /* it's something other than an object */
                        G_tok->log_error(TCERR_MMPARAM_NOT_OBJECT,
                                         (int)init_tok.get_text_len(),
                                         init_tok.get_text());
                    }
                }
                else
                {
                    /* there's no type name - back up to the param name */
                    G_tok->unget();

                    /*
                     *   We need to add an untyped element to the type list,
                     *   but don't do so quite yet - we need to make sure
                     *   that this isn't a named argument parameter.  Only
                     *   positional elements go in the type list.  For now,
                     *   simply flag it as non-typed.  
                     */
                    is_typed = FALSE;
                }
            }

            /* remember and skip the symbol name */
            varname = *G_tok->getcur();
            G_tok->next();

            /* check for a colon, which might indicate a named parameter */
            named_param = FALSE;
            if (G_tok->cur() == TOKT_COLON)
            {
                /* it looks like a named param so far */
                named_param = TRUE;

                /*
                 *   There's one case where a colon *doesn't* indicate a
                 *   named parameter, which is when it's the closing colon of
                 *   a short-form anonymous function parameter list.  For
                 *   those, the colon is a name marker only if it's followed
                 *   by a continuation of the formal list: specifically,
                 *   another parameter (so, a comma), or ':' to indicate the
                 *   actual end of the list.  If anything else follows, the
                 *   colon is the terminator rather than part of the formal
                 *   list.  
                 */
                if (for_short_anon_func)
                {
                    /* check the next token */
                    switch (G_tok->next())
                    {
                    case TOKT_COMMA:
                    case TOKT_COLON:
                        /* 
                         *   More list follows, so this is indeed a named
                         *   parameter marker. 
                         */
                        break;
                        
                    default:
                        /* 
                         *   We don't have more list, so this colon is the
                         *   end marker for the formal list.  Put it back and
                         *   continue.  
                         */
                        named_param = FALSE;
                        G_tok->unget();
                        break;
                    }
                }
                else
                {
                    /* 
                     *   for regular argument lists, this can only be a named
                     *   parameter indicator; skip it
                     */
                    G_tok->next();
                }

                /* named parameters can't be typed */
                if (named_param && is_typed)
                {
                    G_tok->log_error(TCERR_NAMED_ARG_NO_TYPE,
                                     (int)varname.get_text_len(),
                                     varname.get_text());
                }
            }
            
            /* 
             *   check for an optionality flag (a '?' suffix) or a default
             *   value ('= <expression>') 
             */
            opt_param = FALSE;
            suffix_tok = G_tok->cur();
            defval_expr = 0;
            if (opt_allowed
                && (suffix_tok == TOKT_QUESTION || suffix_tok == TOKT_EQ))
            {
                /* it's optional */
                opt_param = TRUE;
                
                /* count the optional argument */
                if (opt_argc != 0 && !named_param)
                    ++(*opt_argc);

                /* skip the suffix token */
                G_tok->next();
                
                /* if it was an '=', parse the default value expression */
                if (suffix_tok == TOKT_EQ)
                {
                    /* 
                     *   parse the expression - comma has precedence in this
                     *   context as an argument separator, so we need to
                     *   parse this as an assignment expression (this is for
                     *   precedence reasons, NOT because it's syntactically
                     *   like an assignment - the '=' postfix to the argument
                     *   name isn't part of the expression we're parsing) 
                     */
                    defval_expr = parse_asi_expr();
                }
            }

            /* 
             *   if any previous arguments are optional, all subsequent
             *   arguments must be optional as well 
             */
            if (opt_allowed
                && opt_argc != 0 && *opt_argc != 0
                && !opt_param && !named_param)
            {
                /* flag it as an error */
                G_tok->log_error(TCERR_ARG_MUST_BE_OPT,
                                 (int)varname.get_text_len(),
                                 varname.get_text());
            }
            
            /* if we're creating symbol table entries, add this symbol */
            lcl = 0;
            if (!count_only)
            {
                /* 
                 *   create a new local symbol table if we don't already have
                 *   one 
                 */
                create_scope_local_symtab();

                /*
                 *   Insert the new variable for the formal.  If it's a named
                 *   parameter or an optional parameter, it's not a real
                 *   formal, since it doesn't point directly to a parameter
                 *   slot in the stack frame - it points instead to a regular
                 *   local variable slot that we have to set up with
                 *   generated code in the function prolog.  
                 */
                if (named_param || opt_param)
                {
                    /* it's a pseudo-formal - create a local for it */
                    lcl = local_symtab_->add_local(
                        varname.get_text(), varname.get_text_len(),
                        alloc_local(), FALSE, FALSE, FALSE);

                    /* set the special flags */
                    lcl->set_named_param(named_param);
                    lcl->set_opt_param(opt_param);

                    /* remember the default value expression, if any */
                    if (defval_expr != 0)
                        lcl->set_defval_expr(defval_expr, defval_cnt++);
                }
                else
                {
                    /* insert the new local variable for the formal */
                    lcl = local_symtab_->add_formal(
                        varname.get_text(), varname.get_text_len(),
                        base_formal_num + *argc, FALSE);
                }

                /* 
                 *   If it's a position parameter, set its parameter index.
                 *   Since optional parameters are actually stored as local
                 *   variables, we need to separately track the parameter
                 *   list index so that we can load the value into the local
                 *   on function entry.  
                 */
                if (!named_param && lcl != 0)
                    lcl->set_param_index(*argc);
            }

            /* 
             *   If it's not a named parameter, count it.  Named parameters
             *   don't count as formals since they're not part of the
             *   positional list and aren't in the parameter area of the
             *   stack frame. 
             */
            if (!named_param)
            {
                /* count it in the positional list */
                ++(*argc);

                /* if it was untyped, add it to the type list */
                if (type_list != 0 && *type_list != 0 && !is_typed)
                    (*type_list)->add_untyped_param();
            }

            /* check for the closing token */
            if (G_tok->cur() == end_tok)
            {
                /* it's the closing token - skip it and stop scanning */
                goto handle_end_tok;
            }

            /* check what follows */
            switch (G_tok->cur())
            {
            case TOKT_COMMA:
                /* skip the comma and continue */
                G_tok->next();
                break;

            case TOKT_SEM:
            case TOKT_RBRACE:
            case TOKT_LBRACE:
            case TOKT_EQ:
            case TOKT_EOF:
                /* 
                 *   We've obviously left the list - the problem is
                 *   probably that we're missing the right paren.  Catch
                 *   it in the main loop.  
                 */
                break;

            case TOKT_SYM:
                /* 
                 *   they seem to have left out a comma - keep parsing
                 *   from the symbol token 
                 */
                G_tok->log_error_curtok(TCERR_REQ_COMMA_FORMAL);
                break;

            default:
                /* anything else is an error */
                G_tok->log_error_curtok(TCERR_REQ_COMMA_FORMAL);
                
                /* skip the errant token and continue */
                G_tok->next();
                break;
            }

            /* done with the formal */
            break;

        case TOKT_SEM:
        case TOKT_RBRACE:
        case TOKT_LBRACE:
        case TOKT_EOF:
            /* 
             *   We've obviously left the list - the problem is probably
             *   that we're missing the right paren.  Log an error and
             *   stop scanning.  
             */
            G_tok->log_error_curtok(missing_end_tok_err);
            done = TRUE;
            break;

        default:
            /* check to see if it's the ending token */
            if (G_tok->cur() == end_tok)
            {
                /* 
                 *   they seem to have put in a comma followed by the
                 *   ending token - it's probably just a stray extra comma 
                 */
                G_tok->log_error(TCERR_MISSING_LAST_FORMAL);
                
                /* skip the paren and stop scanning */
                G_tok->next();
                done = TRUE;
                break;
            }

            /*
             *   If this is a short-form anonymous function's parameter
             *   list, they probably forgot the colon - generate a more
             *   specific error for this case, and assume the list ends
             *   here.  
             */
            if (for_short_anon_func)
            {
                /* tell them they left out the colon */
                G_tok->log_error_curtok(TCERR_MISSING_COLON_FORMAL);
                
                /* presume the argument list was meant to end here */
                done = TRUE;
                break;
            }
            
            /* 
             *   anything else is probably just an extraneous token; skip
             *   it and go on 
             */
            G_tok->log_error_curtok(TCERR_REQ_SYM_FORMAL);
            G_tok->next();
            break;

        handle_end_tok:
            /* we've reached the end token - skip it, and we're done */
            G_tok->next();
            done = TRUE;
            break;
        }
    }

    /*
     *   Check for the "multimethod" modifier, if allowed.  It's allowed if a
     *   formal type list is allowed and this is a normal full parameter list
     *   (i.e., specified in parentheses rather than as an anonymous function
     *   formal list).  
     */
    if (G_tok->cur() == TOKT_SYM
        && G_tok->cur_tok_matches("multimethod", 11))
    {
        /* make sure it's allowed */
        if (type_list != 0 && end_tok == TOKT_RPAR)
        {
            /* it's allowed - create the type list if we haven't already */
            if (*type_list == 0)
            {
                /* create the type list */
                *type_list = new (G_prsmem) CTcFormalTypeList();

                /* add untyped parameters for the ones we've defined */
                (*type_list)->add_untyped_params(*argc);

                /* mark it as varargs if applicable */
                if (*varargs)
                    (*type_list)->add_ellipsis();
            }
        }
        else
        {
            /* it's not allowed - flag it as an error */
            G_tok->log_error(TCERR_MULTIMETHOD_NOT_ALLOWED);
        }

        /* skip the token */
        G_tok->next();
    }

    /* deduct the optional arguments from the fixed arguments */
    if (opt_argc != 0)
        *argc -= *opt_argc;
}